

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::test_event_detected_falling(APITests *this)

{
  initializer_list<std::pair<int,_bool>_> __l;
  initializer_list<std::pair<int,_bool>_> __l_00;
  allocator_type local_41;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> local_40;
  pair<int,_bool> local_28;
  undefined4 local_20;
  undefined1 local_1c;
  undefined4 local_18;
  undefined1 local_14;
  undefined4 local_10;
  undefined1 local_c;
  
  local_28.first = 0;
  local_28.second = true;
  local_20 = 1;
  local_1c = 0;
  local_18 = 0;
  local_14 = 1;
  local_10 = 1;
  local_c = 0;
  __l._M_len = 4;
  __l._M_array = &local_28;
  std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::vector
            (&local_40,__l,&local_41);
  _test_events(this,1,FALLING,&local_40,false,false);
  if (local_40.super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_28.first = 1;
  local_28.second = false;
  local_20 = 0;
  local_1c = 1;
  local_18 = 1;
  local_14 = 0;
  local_10 = 0;
  local_c = 1;
  __l_00._M_len = 4;
  __l_00._M_array = &local_28;
  std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::vector
            (&local_40,__l_00,&local_41);
  _test_events(this,0,FALLING,&local_40,true,false);
  if (local_40.super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_event_detected_falling()
    {
        _test_events(
            GPIO::HIGH, 
            GPIO::FALLING, 
            { 
                {GPIO::LOW, true}, 
                {GPIO::HIGH, false}, 
                {GPIO::LOW, true}, 
                {GPIO::HIGH, false}
            }, 
            false, 
            false
        );
        _test_events(
            GPIO::LOW, 
            GPIO::FALLING, 
            { 
                {GPIO::HIGH, false}, 
                {GPIO::LOW, true}, 
                {GPIO::HIGH, false},
                {GPIO::LOW, true} 
            }, 
            true, 
            false
        );
    }